

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Persistent_cohomology.h
# Opt level: O1

void __thiscall
Gudhi::persistent_cohomology::
Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
::compute_persistent_cohomology
          (Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>
           *this,Filtration_value min_interval_length)

{
  _Rb_tree_header *p_Var1;
  Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this_00;
  pointer pvVar2;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  iterator iVar6;
  Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>,_std::less<int>,_void>_>
  *pSVar7;
  __node_base_ptr p_Var8;
  _Base_ptr p_Var9;
  __hash_code __code;
  ulong uVar10;
  int dim_sigma;
  ulong uVar11;
  uint *puVar12;
  _Hash_node_base *p_Var13;
  __node_base_ptr p_Var14;
  pointer pvVar15;
  uint uVar16;
  Simplex_key idx_fil;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertices;
  pair<const_unsigned_int,_Gudhi::persistent_cohomology::Persistent_cohomology<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>,_Gudhi::persistent_cohomology::Field_Zp>::cocycle>
  cocycle;
  uint local_8c;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_88;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
  local_80;
  uint *local_78;
  iterator iStack_70;
  uint *local_68;
  undefined1 local_58 [32];
  Simplex_handle local_38;
  
  if (0 < this->dim_max_) {
    (this->interval_length_policy).min_length_ = min_interval_length;
    local_8c = 0xffffffff;
    local_78 = (uint *)0x0;
    iStack_70._M_current = (uint *)0x0;
    local_68 = (uint *)0x0;
    this_00 = this->cpx_;
    if ((this_00->filtration_vect_).
        super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this_00->filtration_vect_).
        super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_58._0_8_ = this_00;
      Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
      initialize_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::is_before_in_totally_ordered_filtration,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::initialize_filtration(bool)const::_lambda(boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>)_2_>
                (this_00,(is_before_in_totally_ordered_filtration *)local_58,
                 (anon_class_1_0_00000001 *)&local_88);
    }
    pvVar2 = (this_00->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    puVar12 = local_78;
    iVar6._M_current = iStack_70._M_current;
    for (pvVar15 = (this_00->filtration_vect_).
                   super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; local_78 = puVar12,
        iStack_70._M_current = iVar6._M_current, pvVar15 != pvVar2; pvVar15 = pvVar15 + 1) {
      ppVar3 = pvVar15->m_ptr;
      uVar16 = local_8c + 1;
      local_8c = uVar16;
      local_88.m_ptr = ppVar3;
      Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::_to_node_it
                ((Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *)local_58,
                 (Simplex_handle *)this->cpx_);
      (((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
         *)(local_58._0_8_ + 8))->super_Key_simplex_base).key_ = uVar16;
      uVar16 = (ppVar3->second).super_Key_simplex_base.key_;
      (this->dsets_).parent[uVar16] = uVar16;
      (this->dsets_).rank[uVar16] = 0;
      pSVar7 = (ppVar3->second).children_;
      if (pSVar7->parent_ == ppVar3->first) {
        pSVar7 = pSVar7->oncles_;
      }
      dim_sigma = -1;
      for (; pSVar7 != (Siblings *)0x0; pSVar7 = pSVar7->oncles_) {
        dim_sigma = dim_sigma + 1;
      }
      if (dim_sigma == 0) {
        if (iStack_70._M_current == local_68) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_78,iStack_70,
                     &local_8c);
        }
        else {
          *iStack_70._M_current = local_8c;
          iStack_70._M_current = iStack_70._M_current + 1;
        }
      }
      else if (dim_sigma == 1) {
        local_38.m_ptr = ppVar3;
        update_cohomology_groups_edge(this,&local_38);
      }
      else {
        local_58._24_8_ = ppVar3;
        update_cohomology_groups(this,(Simplex_handle *)(local_58 + 0x18),dim_sigma);
      }
      puVar12 = local_78;
      iVar6._M_current = iStack_70._M_current;
    }
    if (puVar12 != iVar6._M_current) {
      do {
        uVar16 = *puVar12;
        uVar10 = (ulong)uVar16;
        if ((this->ds_parent_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar10] == uVar16) {
          uVar4 = (this->zero_cocycles_)._M_h._M_bucket_count;
          uVar11 = uVar10 % uVar4;
          p_Var5 = (this->zero_cocycles_)._M_h._M_buckets[uVar11];
          p_Var8 = (__node_base_ptr)0x0;
          if ((p_Var5 != (__node_base_ptr)0x0) &&
             (p_Var8 = p_Var5, p_Var14 = p_Var5->_M_nxt,
             uVar16 != *(uint *)&p_Var5->_M_nxt[1]._M_nxt)) {
            while (p_Var13 = p_Var14->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
              p_Var8 = (__node_base_ptr)0x0;
              if (((ulong)*(uint *)&p_Var13[1]._M_nxt % uVar4 != uVar11) ||
                 (p_Var8 = p_Var14, p_Var14 = p_Var13, uVar16 == *(uint *)&p_Var13[1]._M_nxt))
              goto LAB_00109865;
            }
            p_Var8 = (__node_base_ptr)0x0;
          }
LAB_00109865:
          if ((p_Var8 == (__node_base_ptr)0x0) || (p_Var8->_M_nxt == (_Hash_node_base *)0x0)) {
            local_58._0_8_ =
                 (this->cpx_->filtration_vect_).
                 super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar10].m_ptr;
            local_88.m_ptr =
                 (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                  *)0x0;
            local_80.m_ptr._0_4_ = (this->coeff_field_).Prime;
            std::
            vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
            ::
            emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>
                      ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                        *)&this->persistent_pairs_,
                       (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                        *)local_58,&local_88,(int *)&local_80);
          }
        }
        puVar12 = puVar12 + 1;
      } while (puVar12 != iVar6._M_current);
    }
    p_Var13 = (this->zero_cocycles_)._M_h._M_before_begin._M_nxt;
    if (p_Var13 != (_Hash_node_base *)0x0) {
      do {
        local_58._0_8_ =
             (this->cpx_->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start[*(uint *)((long)&p_Var13[1]._M_nxt + 4)].
             m_ptr;
        local_88.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)0x0;
        local_80.m_ptr._0_4_ = (this->coeff_field_).Prime;
        std::
        vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
        ::
        emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>
                  ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                    *)&this->persistent_pairs_,
                   (vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>
                    *)local_58,&local_88,(int *)&local_80);
        p_Var13 = p_Var13->_M_nxt;
      } while (p_Var13 != (_Hash_node_base *)0x0);
    }
    p_Var9 = (this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->transverse_idx_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      do {
        local_58._16_8_ = p_Var9[1]._M_left;
        local_58._0_8_ = *(undefined8 *)(p_Var9 + 1);
        local_58._8_8_ = p_Var9[1]._M_parent;
        local_88.m_ptr =
             (this->cpx_->filtration_vect_).
             super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
             ._M_impl.super__Vector_impl_data._M_start[local_58._0_8_ & 0xffffffff].m_ptr;
        local_80.m_ptr =
             (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
              *)0x0;
        std::
        vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
        ::
        emplace_back<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int&>
                  ((vector<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>,std::allocator<std::tuple<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>>*,true>,int>>>
                    *)&this->persistent_pairs_,&local_88,&local_80,(int *)(local_58 + 0x10));
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
    if (local_78 != (uint *)0x0) {
      operator_delete(local_78,(long)local_68 - (long)local_78);
    }
  }
  return;
}

Assistant:

void compute_persistent_cohomology(Filtration_value min_interval_length = 0) {
    if (dim_max_ <= 0)
      return;  // --------->>

    interval_length_policy.set_length(min_interval_length);
    Simplex_key idx_fil = -1;
    std::vector<Simplex_key> vertices; // so we can check the connected components at the end
    // Compute all finite intervals
    for (auto sh : cpx_->filtration_simplex_range()) {
      cpx_->assign_key(sh, ++idx_fil);
      dsets_.make_set(cpx_->key(sh));
      int dim_simplex = cpx_->dimension(sh);
      switch (dim_simplex) {
        case 0:
          vertices.push_back(idx_fil);
          break;
        case 1:
          update_cohomology_groups_edge(sh);
          break;
        default:
          update_cohomology_groups(sh, dim_simplex);
          break;
      }
    }
    // Compute infinite intervals of dimension 0
    for (Simplex_key key : vertices) {  // for all 0-dimensional simplices
      if (ds_parent_[key] == key  // root of its tree
      && zero_cocycles_.find(key) == zero_cocycles_.end()) {
        persistent_pairs_.emplace_back(
            cpx_->simplex(key), cpx_->null_simplex(), coeff_field_.characteristic());
      }
    }
    for (auto zero_idx : zero_cocycles_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(zero_idx.second), cpx_->null_simplex(), coeff_field_.characteristic());
    }
    // Compute infinite interval of dimension > 0
    for (auto cocycle : transverse_idx_) {
      persistent_pairs_.emplace_back(
          cpx_->simplex(cocycle.first), cpx_->null_simplex(), cocycle.second.characteristics_);
    }
  }